

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Encode(Directed_Energy_Fire_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_FiringEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  (*(this->m_MunTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_MunTyp,stream);
  (*(this->m_ShotStartTime).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ShotStartTime,stream)
  ;
  KDataStream::Write<float>(stream,(float)this->m_f32CumulativeShotTime);
  (*(this->m_EmitterLoc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EmitterLoc,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32AperDiameter);
  KDataStream::Write<float>(stream,(float)this->m_f32Wavelength);
  KDataStream::Write<float>(stream,(float)this->m_f32PeakIrradiance);
  KDataStream::Write<float>(stream,(float)this->m_f32PulseRepFreq);
  KDataStream::Write<float>(stream,(float)this->m_f32PulseWidth);
  KDataStream::Write<unsigned_short>(stream,(this->m_DeUnion).m_ui16Flags);
  KDataStream::Write(stream,this->m_ui8PulseShp);
  KDataStream::Write(stream,this->m_ui8Padding1);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding2);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding3);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumDERecs);
  pKVar1 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vDeRec).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_FiringEntityID
           << KDIS_STREAM m_EventID
           << KDIS_STREAM m_MunTyp
           << KDIS_STREAM m_ShotStartTime
           << m_f32CumulativeShotTime
           << KDIS_STREAM m_EmitterLoc
           << m_f32AperDiameter
           << m_f32Wavelength
           << m_f32PeakIrradiance
           << m_f32PulseRepFreq
           << m_f32PulseWidth
           << m_DeUnion.m_ui16Flags
           << m_ui8PulseShp
           << m_ui8Padding1
           << m_ui32Padding2
           << m_ui16Padding3
           << m_ui16NumDERecs;

    vector<StdVarPtr>::const_iterator citr = m_vDeRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDeRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}